

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int CVmObjByteArray::static_packBytes(vm_val_t *retval,uint *oargc)

{
  CVmObjPageEntry *pCVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  CVmMemorySource *this;
  undefined8 *puVar6;
  long *plVar7;
  undefined4 extraout_var;
  uint argc;
  err_frame_t err_cur__;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (static_packBytes(vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&static_packBytes(vm_val_t*,unsigned_int*)::desc);
    if (iVar4 != 0) {
      static_packBytes::desc.min_argc_ = 1;
      static_packBytes::desc.opt_argc_ = 0;
      static_packBytes::desc.varargs_ = 1;
      __cxa_guard_release(&static_packBytes(vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&static_packBytes::desc);
  if (iVar4 == 0) {
    this = (CVmMemorySource *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource(this,0);
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar6;
    plVar7 = (long *)_ZTW11G_err_frame();
    *plVar7 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      CVmPack::pack(0,argc,(CVmDataSource *)this);
      iVar4 = (*(this->super_CVmDataSource)._vptr_CVmDataSource[6])(this);
      vVar5 = create(0,CONCAT44(extraout_var,iVar4));
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar5;
      pCVar1 = G_obj_table_X.pages_[vVar5 >> 0xc];
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[8])(this,0,0);
      read_from_file((CVmObjByteArray *)(pCVar1 + (vVar5 & 0xfff)),(retval->val).obj,
                     (CVmDataSource *)this,1,CONCAT44(extraout_var,iVar4),0);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[1])(this);
    }
    peVar2 = err_cur__.prv_;
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    *puVar6 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar6 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar6 & 2) != 0) {
        plVar7 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar7 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar7 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar7 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::static_packBytes(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up an in-memory data stream to receive the packed data */
    CVmMemorySource *dst = new CVmMemorySource(0L);

    err_try
    {
        /* do the packing */
        CVmPack::pack(vmg_ 0, argc, dst);

        /* create a byte array to hold the packed data */
        long len = dst->get_size();
        retval->set_obj(create(vmg_ FALSE, len));
        CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

        /* 
         *   copy the bytes from the stream to the byte array; it's a new
         *   object, so there's no undo to save 
         */
        dst->seek(0, OSFSK_SET);
        arr->read_from_file(vmg_ retval->val.obj, dst, 1, len, FALSE);
    }